

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

int ixxx::posix::mkstemp(char *__template)

{
  int iVar1;
  mkstemp_error *this;
  int *piVar2;
  
  iVar1 = ::mkstemp(__template);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (mkstemp_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  mkstemp_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&mkstemp_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

int mkstemp(char *tmplate)
    {
      int r = ::mkstemp(tmplate);
      if (r == -1)
        throw mkstemp_error(errno);
      return r;
    }